

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void nlohmann::json_abi_v3_11_3::detail::replace_substring<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *f,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t)

{
  byte bVar1;
  string *psVar2;
  ulong local_28;
  size_type pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *f_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_local;
  
  bVar1 = std::__cxx11::string::empty();
  if (((bVar1 ^ 0xff) & 1) == 0) {
    __assert_fail("!f.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pantor[P]inja/third_party/include/nlohmann/json.hpp"
                  ,0xb9e,
                  "void nlohmann::detail::replace_substring(StringType &, const StringType &, const StringType &) [StringType = std::basic_string<char>]"
                 );
  }
  local_28 = std::__cxx11::string::find((string *)s,(ulong)f);
  while (local_28 != 0xffffffffffffffff) {
    psVar2 = (string *)std::__cxx11::string::size();
    std::__cxx11::string::replace((ulong)s,local_28,psVar2);
    std::__cxx11::string::size();
    local_28 = std::__cxx11::string::find((string *)s,(ulong)f);
  }
  return;
}

Assistant:

inline void replace_substring(StringType& s, const StringType& f,
                              const StringType& t)
{
    JSON_ASSERT(!f.empty());
    for (auto pos = s.find(f);                // find first occurrence of f
            pos != StringType::npos;          // make sure f was found
            s.replace(pos, f.size(), t),      // replace with t, and
            pos = s.find(f, pos + t.size()))  // find next occurrence of f
    {}
}